

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O1

void __thiscall IZDeflate::send_all_trees(IZDeflate *this,int lcodes,int dcodes,int blcodes)

{
  ulong uVar1;
  
  send_bits(this,lcodes + -0x101,5);
  send_bits(this,dcodes + -1,5);
  send_bits(this,blcodes + -4,4);
  if (0 < blcodes) {
    uVar1 = 0;
    do {
      send_bits(this,(uint)this->bl_tree[this->bl_order[uVar1]].dl.dad,3);
      uVar1 = uVar1 + 1;
    } while ((uint)blcodes != uVar1);
  }
  send_tree(this,this->dyn_ltree,lcodes + -1);
  send_tree(this,this->dyn_dtree,dcodes + -1);
  return;
}

Assistant:

void IZDeflate::send_all_trees(int lcodes, int dcodes, int blcodes)
    // int lcodes, dcodes, blcodes; /* number of codes for each tree */
{
    int rank;                    /* index in bl_order */

    Assert(lcodes >= 257 && dcodes >= 1 && blcodes >= 4, "not enough codes");
    Assert(lcodes <= L_CODES && dcodes <= D_CODES && blcodes <= BL_CODES,
            "too many codes");
    Tracev((stderr, "\nbl counts: "));
    send_bits(lcodes-257, 5);
    /* not +255 as stated in appnote.txt 1.93a or -256 in 2.04c */
    send_bits(dcodes-1,   5);
    send_bits(blcodes-4,  4); /* not -3 as stated in appnote.txt */
    for (rank = 0; rank < blcodes; rank++) {
        Tracev((stderr, "\nbl code %2d ", bl_order[rank]));
        send_bits(bl_tree[bl_order[rank]].Len, 3);
    }
    Tracev((stderr, "\nbl tree: sent %s",
     zip_fuzofft(bits_sent, NULL, NULL)));

    send_tree((ct_data near *)dyn_ltree, lcodes-1); /* send the literal tree */
    Tracev((stderr, "\nlit tree: sent %s",
     zip_fuzofft(bits_sent, NULL, NULL)));

    send_tree((ct_data near *)dyn_dtree, dcodes-1); /* send the distance tree */
    Tracev((stderr, "\ndist tree: sent %ld",
     zip_fuzofft(bits_sent, NULL, NULL)));
}